

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

size_t write_str_tag(MIR_context_t ctx,writer_func_t writer,MIR_str_t str,bin_tag_t start_tag)

{
  io_ctx *piVar1;
  reduce_data *data;
  bool bVar2;
  string_t el;
  int iVar3;
  ulong uVar4;
  uint8_t uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  string_t string;
  string_t local_58;
  string_t local_40;
  
  local_58.str.s = str.s;
  local_58.str.len = str.len;
  piVar1 = ctx->io_ctx;
  if (writer == (writer_func_t)0x0) {
    string_store(&local_58,ctx,&piVar1->output_strings,&piVar1->output_string_tab,str);
    sVar9 = 0;
  }
  else {
    el.str.len = local_58.str.len;
    el.num = local_58.num;
    el.str.s = local_58.str.s;
    iVar3 = HTAB_string_t_do(piVar1->output_string_tab,el,HTAB_FIND,&local_40);
    if ((iVar3 == 0) || (local_40.num == 0)) {
      __assert_fail("ok_p && string.num >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x12ba,
                    "size_t write_str_tag(MIR_context_t, writer_func_t, MIR_str_t, bin_tag_t)");
    }
    if (local_40.num < 0x81) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      uVar4 = local_40.num - 1;
      do {
        uVar8 = uVar8 + 1;
        bVar2 = 0xff < uVar4;
        uVar4 = uVar4 >> 8;
      } while (bVar2);
    }
    if (4 < uVar8) {
      __assert_fail("nb <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x12bc,
                    "size_t write_str_tag(MIR_context_t, writer_func_t, MIR_str_t, bin_tag_t)");
    }
    uVar8 = uVar8 + (uVar8 == 0);
    uVar5 = (char)start_tag + -1 + (char)uVar8;
    data = ctx->io_ctx->io_reduce_data;
    uVar6 = data->buf_bound;
    if ((ulong)uVar6 < 0x40000) {
      data->buf_bound = uVar6 + 1;
      data->buf[uVar6] = uVar5;
    }
    else {
      _reduce_encode_buf(data);
      data->buf_bound = 1;
      data->buf[0] = uVar5;
    }
    uVar7 = local_40.num - 1;
    uVar4 = uVar8 & 0xffffffff;
    do {
      put_byte(ctx,writer,(uint)uVar7 & 0xff);
      uVar7 = uVar7 >> 8;
      uVar6 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar6;
    } while (uVar6 != 0);
    sVar9 = uVar8 + 1;
  }
  return sVar9;
}

Assistant:

static size_t write_str_tag (MIR_context_t ctx, writer_func_t writer, MIR_str_t str,
                             bin_tag_t start_tag) {
  size_t nb;
  int ok_p;
  string_t string;

  if (writer == NULL) {
    string_store (ctx, &output_strings, &output_string_tab, str);
    return 0;
  }
  ok_p = string_find (&output_strings, &output_string_tab, str, &string);
  mir_assert (ok_p && string.num >= 1);
  nb = uint_length (string.num - 1);
  mir_assert (nb <= 4);
  if (nb == 0) nb = 1;
  put_byte (ctx, writer, start_tag + (int) nb - 1);
  return put_uint (ctx, writer, string.num - 1, (int) nb) + 1;
}